

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

ulong __thiscall nuraft::raft_server::term_for_log(raft_server *this,ulong log_idx)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  element_type *peVar5;
  ulong uVar6;
  element_type *peVar7;
  element_type *peVar8;
  ulong uVar9;
  element_type *peVar10;
  undefined4 extraout_var_01;
  ulong in_RSI;
  long in_RDI;
  int log_lv;
  ptr<snapshot> last_snapshot;
  undefined8 in_stack_fffffffffffffed0;
  undefined1 fire_first_event;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  timer_helper *in_stack_fffffffffffffee0;
  timer_helper *in_stack_ffffffffffffff18;
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  int local_38;
  __shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2> local_28;
  ulong local_18;
  ulong local_8;
  
  fire_first_event = (undefined1)((ulong)in_stack_fffffffffffffed0 >> 0x38);
  if (in_RSI == 0) {
    return 0;
  }
  local_18 = in_RSI;
  peVar4 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x222267);
  iVar2 = (*peVar4->_vptr_log_store[3])();
  if (CONCAT44(extraout_var,iVar2) <= in_RSI) {
    peVar4 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x222294);
    iVar2 = (*peVar4->_vptr_log_store[0xb])(peVar4,local_18);
    return CONCAT44(extraout_var_00,iVar2);
  }
  peVar5 = std::__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2222c6);
  (*peVar5->_vptr_state_machine[0x10])(&local_28);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_28);
  uVar9 = local_18;
  if (bVar1) {
    peVar8 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x222307);
    uVar6 = snapshot::get_last_log_idx(peVar8);
    if (uVar9 == uVar6) {
      peVar8 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x222772);
      local_8 = snapshot::get_last_log_term(peVar8);
      goto LAB_00222797;
    }
  }
  if ((term_for_log(unsigned_long)::bad_log_timer == '\0') &&
     (iVar2 = __cxa_guard_acquire(&term_for_log(unsigned_long)::bad_log_timer), iVar2 != 0)) {
    timer_helper::timer_helper
              (in_stack_fffffffffffffee0,
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),(bool)fire_first_event)
    ;
    __cxa_guard_release(&term_for_log(unsigned_long)::bad_log_timer);
  }
  bVar1 = timer_helper::timeout_and_reset(in_stack_ffffffffffffff18);
  local_38 = 6;
  if (bVar1) {
    local_38 = 2;
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar1) {
    peVar10 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2223cb);
    iVar2 = (**(code **)(*(long *)peVar10 + 0x38))();
    if (local_38 <= iVar2) {
      peVar10 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x222402);
      iVar2 = local_38;
      msg_if_given_abi_cxx11_
                ((char *)local_58,
                 "bad log_idx %lu for retrieving the term value, will ignore this log req",local_18)
      ;
      (**(code **)(*(long *)peVar10 + 0x40))
                (peVar10,iVar2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"term_for_log",0x601,local_58);
      std::__cxx11::string::~string(local_58);
    }
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_28);
  if ((bVar1) &&
     (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318)), bVar1)) {
    peVar10 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x22251c);
    iVar2 = (**(code **)(*(long *)peVar10 + 0x38))();
    if (local_38 <= iVar2) {
      peVar10 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x222553);
      iVar2 = local_38;
      peVar7 = std::__shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>::get(&local_28);
      peVar8 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x222591);
      uVar9 = snapshot::get_last_log_idx(peVar8);
      msg_if_given_abi_cxx11_
                ((char *)local_78,"last snapshot %p, log_idx %lu, snapshot last_log_idx %lu\n",
                 peVar7,local_18,uVar9);
      (**(code **)(*(long *)peVar10 + 0x40))
                (peVar10,iVar2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"term_for_log",0x605,local_78);
      std::__cxx11::string::~string(local_78);
    }
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar1) {
    peVar10 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x22265f);
    iVar2 = (**(code **)(*(long *)peVar10 + 0x38))();
    if (local_38 <= iVar2) {
      peVar10 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x222696);
      iVar2 = local_38;
      peVar4 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2226ba);
      iVar3 = (*peVar4->_vptr_log_store[3])();
      msg_if_given_abi_cxx11_
                ((char *)local_98,"log_store_->start_index() %lu",CONCAT44(extraout_var_01,iVar3));
      (**(code **)(*(long *)peVar10 + 0x40))
                (peVar10,iVar2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"term_for_log",0x607,local_98);
      std::__cxx11::string::~string(local_98);
    }
  }
  local_8 = 0;
LAB_00222797:
  std::shared_ptr<nuraft::snapshot>::~shared_ptr((shared_ptr<nuraft::snapshot> *)0x2227a4);
  return local_8;
}

Assistant:

ulong raft_server::term_for_log(ulong log_idx) {
    if (log_idx == 0) {
        return 0L;
    }

    if (log_idx >= log_store_->start_index()) {
        return log_store_->term_at(log_idx);
    }

    ptr<snapshot> last_snapshot(state_machine_->last_snapshot());
    if ( !last_snapshot || log_idx != last_snapshot->get_last_log_idx() ) {
        static timer_helper bad_log_timer(1000000, true);
        int log_lv = bad_log_timer.timeout_and_reset() ? L_ERROR : L_TRACE;

        p_lv(log_lv, "bad log_idx %" PRIu64 " for retrieving the term value, "
             "will ignore this log req", log_idx);
        if (last_snapshot) {
            p_lv(log_lv, "last snapshot %p, log_idx %" PRIu64
                 ", snapshot last_log_idx %" PRIu64 "\n",
                 last_snapshot.get(), log_idx, last_snapshot->get_last_log_idx());
        }
        p_lv(log_lv, "log_store_->start_index() %" PRIu64, log_store_->start_index());
        //ctx_->state_mgr_->system_exit(raft_err::N19_bad_log_idx_for_term);
        //::exit(-1);
        return 0L;
    }

    return last_snapshot->get_last_log_term();
}